

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool compilearg(vector<unsigned_int> *code,char **p,int wordtype)

{
  bool bVar1;
  int local_34;
  bool more;
  char *pcStack_30;
  int wordlen;
  char *word;
  char **ppcStack_20;
  int wordtype_local;
  char **p_local;
  vector<unsigned_int> *code_local;
  
  pcStack_30 = (char *)0x0;
  local_34 = 0;
  word._4_4_ = wordtype;
  ppcStack_20 = p;
  p_local = (char **)code;
  bVar1 = compileword(code,p,wordtype,&stack0xffffffffffffffd0,&local_34);
  if (bVar1) {
    if ((pcStack_30 != (char *)0x0) &&
       (compileval((vector<unsigned_int> *)p_local,word._4_4_,pcStack_30,local_34),
       pcStack_30 != (char *)0x0)) {
      operator_delete__(pcStack_30);
    }
    code_local._7_1_ = true;
  }
  else {
    code_local._7_1_ = false;
  }
  return code_local._7_1_;
}

Assistant:

static inline bool compilearg(vector<uint> &code, const char *&p, int wordtype)
{
    char *word = NULL;
    int wordlen = 0;
    bool more = compileword(code, p, wordtype, word, wordlen);
    if(!more) return false;
    if(word)
    {
        compileval(code, wordtype, word, wordlen);
        delete[] word;
    }
    return true;
}